

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::utils::CommandLineArgs::setArgs(CommandLineArgs *this,int argc,char **argv)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_&&>::value,_pair<iterator,_bool>_>
  _Var4;
  allocator local_121;
  value_type local_120;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_100;
  undefined1 local_f8;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  string local_88 [55];
  allocator local_51;
  undefined1 local_50 [8];
  string key;
  char *v;
  int i;
  char **argv_local;
  int argc_local;
  CommandLineArgs *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->m_params);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->m_paramsWithValue);
  if ((argc != 0) && (argv != (char **)0x0)) {
    this->m_argc = argc;
    this->m_argv = argv;
    for (v._4_4_ = 1; v._4_4_ < this->m_argc; v._4_4_ = v._4_4_ + 1) {
      key.field_2._8_8_ = strstr(this->m_argv[v._4_4_],"=");
      if (((char *)key.field_2._8_8_ != (char *)0x0) &&
         (sVar2 = strlen((char *)key.field_2._8_8_), sVar2 != 0)) {
        pcVar3 = this->m_argv[v._4_4_];
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_50,pcVar3,&local_51);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
        ::std::__cxx11::string::find_first_of((char)local_50,0x3d);
        ::std::__cxx11::string::substr((ulong)local_88,(ulong)local_50);
        ::std::__cxx11::string::operator=((string *)local_50,local_88);
        ::std::__cxx11::string::~string(local_88);
        pcVar3 = (char *)::std::__cxx11::string::c_str();
        bVar1 = hasParamWithValue(this,pcVar3);
        if (!bVar1) {
          pcVar3 = (char *)(key.field_2._8_8_ + 1);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_e8,pcVar3,&local_e9);
          ::std::make_pair<std::__cxx11::string&,std::__cxx11::string>
                    (&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_e8);
          _Var4 = ::std::
                  unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                            ((unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              *)&this->m_paramsWithValue,&local_c8);
          local_100._M_cur =
               (__node_type *)
               _Var4.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._M_cur;
          local_f8 = _Var4.second;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_c8);
          ::std::__cxx11::string::~string((string *)&local_e8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        }
        ::std::__cxx11::string::~string((string *)local_50);
      }
      if ((key.field_2._8_8_ == 0) && (bVar1 = hasParam(this,this->m_argv[v._4_4_]), !bVar1)) {
        pcVar3 = this->m_argv[v._4_4_];
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_120,pcVar3,&local_121);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_params,&local_120);
        ::std::__cxx11::string::~string((string *)&local_120);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_121);
      }
    }
  }
  return;
}

Assistant:

void CommandLineArgs::setArgs(int argc, char** argv) {
  m_params.clear();
  m_paramsWithValue.clear();
  if (argc == 0 || argv == nullptr) {
    return;
  }
  m_argc = argc;
  m_argv = argv;
  for (int i = 1; i < m_argc; ++i) {
    const char* v = (strstr(m_argv[i], "="));
    if (v != nullptr && strlen(v) > 0) {
      std::string key = std::string(m_argv[i]);
      key = key.substr(0, key.find_first_of('='));
      if (hasParamWithValue(key.c_str())) {
        ELPP_INTERNAL_INFO(1, "Skipping [" << key << "] arg since it already has value ["
                           << getParamValue(key.c_str()) << "]");
      } else {
        m_paramsWithValue.insert(std::make_pair(key, std::string(v + 1)));
      }
    }
    if (v == nullptr) {
      if (hasParam(m_argv[i])) {
        ELPP_INTERNAL_INFO(1, "Skipping [" << m_argv[i] << "] arg since it already exists");
      } else {
        m_params.push_back(std::string(m_argv[i]));
      }
    }
  }
}